

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O2

bool tcu::astc::isValidBlock(deUint8 *data,CompressedTexFormat format,AstcMode mode)

{
  bool isSRGB;
  DecompressResult DVar1;
  IVec3 blockPixelSize;
  Block128 blockData;
  anon_union_2304_2_1776bc36 tmpBuffer;
  int local_944;
  int local_940;
  Block128 local_938;
  undefined1 local_928 [2304];
  
  getBlockPixelSize((tcu *)&local_944,format);
  isSRGB = isAstcSRGBFormat(format);
  anon_unknown_0::Block128::Block128(&local_938,data);
  DVar1 = anon_unknown_0::decompressBlock
                    (local_928,&local_938,local_944,local_940,isSRGB,mode == ASTCMODE_LDR || isSRGB)
  ;
  return DVar1 == DECOMPRESS_RESULT_VALID_BLOCK;
}

Assistant:

bool isValidBlock (const deUint8* data, CompressedTexFormat format, TexDecompressionParams::AstcMode mode)
{
	const tcu::IVec3		blockPixelSize	= getBlockPixelSize(format);
	const bool				isSRGB			= isAstcSRGBFormat(format);
	const bool				isLDR			= isSRGB || mode == TexDecompressionParams::ASTCMODE_LDR;

	// sRGB is not supported in HDR mode
	DE_ASSERT(!(mode == TexDecompressionParams::ASTCMODE_HDR && isSRGB));

	union
	{
		deUint8		sRGB[MAX_BLOCK_WIDTH*MAX_BLOCK_HEIGHT*4];
		float		linear[MAX_BLOCK_WIDTH*MAX_BLOCK_HEIGHT*4];
	} tmpBuffer;
	const Block128			blockData		(data);
	const DecompressResult	result			= decompressBlock((isSRGB ? (void*)&tmpBuffer.sRGB[0] : (void*)&tmpBuffer.linear[0]),
															  blockData, blockPixelSize.x(), blockPixelSize.y(), isSRGB, isLDR);

	return result == DECOMPRESS_RESULT_VALID_BLOCK;
}